

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

void __thiscall
llvm::StringMap<unsigned_short,_llvm::MallocAllocator>::~StringMap
          (StringMap<unsigned_short,_llvm::MallocAllocator> *this)

{
  uint uVar1;
  StringMapEntryBase *__ptr;
  ulong uVar2;
  
  if ((this->super_StringMapImpl).NumItems != 0) {
    uVar1 = (this->super_StringMapImpl).NumBuckets;
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      __ptr = (this->super_StringMapImpl).TheTable[uVar2];
      if ((__ptr != (StringMapEntryBase *)0xfffffffffffffff8) &&
         (__ptr != (StringMapEntryBase *)0x0)) {
        free(__ptr);
      }
    }
  }
  free((this->super_StringMapImpl).TheTable);
  return;
}

Assistant:

~StringMap() {
    // Delete all the elements in the map, but don't reset the elements
    // to default values.  This is a copy of clear(), but avoids unnecessary
    // work not required in the destructor.
    if (!empty()) {
      for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
        StringMapEntryBase *Bucket = TheTable[I];
        if (Bucket && Bucket != getTombstoneVal()) {
          static_cast<MapEntryTy*>(Bucket)->Destroy(Allocator);
        }
      }
    }
    free(TheTable);
  }